

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)5>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uint *end;
  double dVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uchar *puVar5;
  uint3 uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  unkuint9 Var78;
  undefined1 auVar79 [15];
  undefined1 auVar80 [13];
  undefined1 auVar81 [15];
  unkuint9 Var82;
  undefined1 auVar83 [15];
  undefined1 auVar84 [13];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [13];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [13];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [13];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [13];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [13];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [13];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [13];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [13];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  int iVar119;
  int iVar120;
  uint uVar121;
  byte bVar125;
  uint uVar122;
  int iVar123;
  uint uVar124;
  int iVar126;
  long lVar127;
  uint uVar128;
  uint uVar129;
  uint *puVar130;
  long lVar131;
  long lVar132;
  uint uVar133;
  long lVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  long in_FS_OFFSET;
  ulong uVar138;
  short sVar139;
  short sVar142;
  double dVar140;
  double dVar141;
  ushort uVar143;
  uint uVar144;
  ushort uVar146;
  double dVar145;
  undefined1 uVar147;
  undefined1 uVar148;
  undefined1 uVar149;
  undefined1 uVar150;
  undefined1 uVar151;
  undefined1 uVar152;
  undefined1 uVar153;
  undefined1 uVar154;
  double dVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  double dVar158;
  double dVar159;
  double dVar172;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  short sVar173;
  short sVar184;
  undefined4 uVar174;
  ulong uVar175;
  undefined1 auVar177 [12];
  undefined1 auVar178 [12];
  undefined1 auVar179 [12];
  double dVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [12];
  undefined1 auVar193 [16];
  byte bVar195;
  double dVar196;
  double dVar197;
  int in_stack_ffffffffffffff08;
  uint local_3c;
  long local_38;
  undefined1 auVar176 [12];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar194 [16];
  
  uVar138 = (ulong)(uint)y;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar145 = (double)x + 0.5;
  dVar158 = (double)y + 0.5;
  end = buffer + length;
  if ((data->field_0x8a & 1) == 0) {
    dVar196 = data->m11;
    dVar197 = data->m12;
  }
  else {
    dVar196 = data->m11;
    dVar197 = data->m12;
    dVar1 = data->m22;
    dVar159 = (dVar158 * data->m21 + dVar145 * dVar196 + data->dx) * 65536.0;
    dVar172 = (dVar158 * dVar1 + dVar145 * dVar197 + data->dy) * 65536.0;
    dVar185 = dVar172;
    if (dVar159 <= dVar172) {
      dVar185 = dVar159;
    }
    dVar140 = trunc(dVar196 * 65536.0);
    dVar141 = trunc(dVar197 * 65536.0);
    dVar155 = (double)length * dVar140 + dVar159;
    dVar141 = (double)length * dVar141 + dVar172;
    dVar140 = dVar141;
    if (dVar155 <= dVar141) {
      dVar140 = dVar155;
    }
    if (dVar185 <= dVar140) {
      dVar140 = dVar185;
    }
    if (-2147483648.0 <= dVar140) {
      dVar185 = dVar172;
      if (dVar172 <= dVar159) {
        dVar185 = dVar159;
      }
      if (dVar141 <= dVar155) {
        dVar141 = dVar155;
      }
      if (dVar141 <= dVar185) {
        dVar141 = dVar185;
      }
      if (dVar141 <= 2147483647.0) {
        uVar144 = (uint)(dVar196 * 65536.0);
        iVar119 = (int)(dVar197 * 65536.0);
        local_3c = (int)dVar159 - 0x8000;
        uVar122 = (int)dVar172 - 0x8000;
        if (iVar119 != 0) {
          uVar138 = -(ulong)(dVar196 < -dVar196);
          if (((double)(~uVar138 & (ulong)dVar196 | (ulong)-dVar196 & uVar138) < 0.125) ||
             (uVar138 = -(ulong)(dVar1 < -dVar1),
             (double)(~uVar138 & (ulong)dVar1 | (ulong)-dVar1 & uVar138) < 0.125)) {
            if (0 < length) {
              puVar5 = (data->field_23).texture.imageData;
              lVar131 = (data->field_23).texture.bytesPerLine;
              puVar130 = buffer;
              uVar128 = local_3c;
              do {
                uVar129 = uVar128 >> 8 & 0xff;
                uVar121 = (data->field_23).texture.width;
                uVar124 = (data->field_23).texture.height;
                iVar120 = ((int)uVar128 >> 0x10) % (int)uVar121;
                uVar135 = uVar122 >> 8 & 0xff;
                uVar136 = iVar120 >> 0x1f & uVar121;
                uVar137 = uVar136 + iVar120 + 1;
                if (uVar137 == uVar121) {
                  uVar137 = 0;
                }
                iVar123 = ((int)uVar122 >> 0x10) % (int)uVar124;
                uVar121 = iVar123 >> 0x1f & uVar124;
                uVar133 = uVar121 + iVar123 + 1;
                if (uVar133 == uVar124) {
                  uVar133 = 0;
                }
                lVar127 = (int)(uVar121 + iVar123) * lVar131;
                lVar134 = (int)uVar133 * lVar131;
                lVar132 = (long)(int)(iVar120 + uVar136);
                uVar174 = *(undefined4 *)(puVar5 + (long)(int)uVar137 * 4 + lVar127);
                uVar2 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar127);
                uVar3 = *(undefined4 *)(puVar5 + (long)(int)uVar137 * 4 + lVar134);
                uVar4 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar134);
                uVar138 = CONCAT44(uVar174,uVar2);
                auVar23._8_6_ = 0;
                auVar23._0_8_ = uVar138;
                auVar23[0xe] = (char)((uint)uVar174 >> 0x18);
                auVar31._8_4_ = 0;
                auVar31._0_8_ = uVar138;
                auVar31[0xc] = (char)((uint)uVar174 >> 0x10);
                auVar31._13_2_ = auVar23._13_2_;
                auVar39._8_4_ = 0;
                auVar39._0_8_ = uVar138;
                auVar39._12_3_ = auVar31._12_3_;
                auVar43._8_2_ = 0;
                auVar43._0_8_ = uVar138;
                auVar43[10] = (char)((uint)uVar174 >> 8);
                auVar43._11_4_ = auVar39._11_4_;
                auVar47._8_2_ = 0;
                auVar47._0_8_ = uVar138;
                auVar47._10_5_ = auVar43._10_5_;
                auVar51[8] = (char)uVar174;
                auVar51._0_8_ = uVar138;
                auVar51._9_6_ = auVar47._9_6_;
                auVar85._7_8_ = 0;
                auVar85._0_7_ = auVar51._8_7_;
                Var78 = CONCAT81(SUB158(auVar85 << 0x40,7),(char)((uint)uVar2 >> 0x18));
                auVar111._9_6_ = 0;
                auVar111._0_9_ = Var78;
                auVar59[4] = (char)((uint)uVar2 >> 0x10);
                auVar59._0_4_ = uVar2;
                auVar59._5_10_ = SUB1510(auVar111 << 0x30,5);
                auVar86._11_4_ = 0;
                auVar86._0_11_ = auVar59._4_11_;
                auVar87._1_12_ = SUB1512(auVar86 << 0x20,3);
                auVar87[0] = (char)((uint)uVar2 >> 8);
                uVar138 = CONCAT44(uVar3,uVar4);
                auVar186 = pshuflw(ZEXT416(0x100 - uVar135),ZEXT416(0x100 - uVar135),0);
                auVar24._8_6_ = 0;
                auVar24._0_8_ = uVar138;
                auVar24[0xe] = (char)((uint)uVar3 >> 0x18);
                auVar32._8_4_ = 0;
                auVar32._0_8_ = uVar138;
                auVar32[0xc] = (char)((uint)uVar3 >> 0x10);
                auVar32._13_2_ = auVar24._13_2_;
                auVar40._8_4_ = 0;
                auVar40._0_8_ = uVar138;
                auVar40._12_3_ = auVar32._12_3_;
                auVar44._8_2_ = 0;
                auVar44._0_8_ = uVar138;
                auVar44[10] = (char)((uint)uVar3 >> 8);
                auVar44._11_4_ = auVar40._11_4_;
                auVar48._8_2_ = 0;
                auVar48._0_8_ = uVar138;
                auVar48._10_5_ = auVar44._10_5_;
                auVar52[8] = (char)uVar3;
                auVar52._0_8_ = uVar138;
                auVar52._9_6_ = auVar48._9_6_;
                auVar88._7_8_ = 0;
                auVar88._0_7_ = auVar52._8_7_;
                Var82 = CONCAT81(SUB158(auVar88 << 0x40,7),(char)((uint)uVar4 >> 0x18));
                auVar112._9_6_ = 0;
                auVar112._0_9_ = Var82;
                auVar60[4] = (char)((uint)uVar4 >> 0x10);
                auVar60._0_4_ = uVar4;
                auVar60._5_10_ = SUB1510(auVar112 << 0x30,5);
                auVar89._11_4_ = 0;
                auVar89._0_11_ = auVar60._4_11_;
                auVar90._1_12_ = SUB1512(auVar89 << 0x20,3);
                auVar90[0] = (char)((uint)uVar4 >> 8);
                auVar193 = pshuflw(ZEXT416(uVar135),ZEXT416(uVar135),0);
                sVar139 = auVar186._0_2_;
                sVar142 = auVar186._2_2_;
                sVar173 = auVar193._0_2_;
                sVar184 = auVar193._2_2_;
                uVar174 = CONCAT22(sVar184 * auVar90._0_2_ + sVar142 * auVar87._0_2_,
                                   sVar173 * (ushort)(byte)uVar4 + sVar139 * (ushort)(byte)uVar2);
                auVar176._0_8_ =
                     CONCAT26(sVar184 * (short)Var82 + sVar142 * (short)Var78,
                              CONCAT24(sVar173 * auVar60._4_2_ + sVar139 * auVar59._4_2_,uVar174));
                auVar176._8_2_ = sVar173 * auVar52._8_2_ + sVar139 * auVar51._8_2_;
                auVar176._10_2_ = sVar184 * auVar44._10_2_ + sVar142 * auVar43._10_2_;
                auVar180._12_2_ = sVar173 * auVar32._12_2_ + sVar139 * auVar31._12_2_;
                auVar180._0_12_ = auVar176;
                auVar180._14_2_ = sVar184 * (auVar24._13_2_ >> 8) + sVar142 * (auVar23._13_2_ >> 8);
                auVar186._0_4_ = CONCAT22((short)uVar129,(short)(0x100 - uVar129));
                auVar186._4_4_ = auVar186._0_4_;
                auVar186._8_4_ = auVar186._0_4_;
                auVar186._12_4_ = auVar186._0_4_;
                auVar160._4_4_ = auVar176._8_4_;
                auVar160._0_4_ = uVar174;
                auVar160._8_4_ = (int)((ulong)auVar176._0_8_ >> 0x20);
                auVar160._12_4_ = auVar180._12_4_;
                auVar193 = pshuflw(auVar160,auVar160,0xd8);
                auVar193 = pshufhw(auVar193,auVar193,0xd8);
                auVar161._0_2_ = auVar193._0_2_ >> 8;
                auVar161._2_2_ = auVar193._2_2_ >> 8;
                auVar161._4_2_ = auVar193._4_2_ >> 8;
                auVar161._6_2_ = auVar193._6_2_ >> 8;
                auVar161._8_2_ = auVar193._8_2_ >> 8;
                auVar161._10_2_ = auVar193._10_2_ >> 8;
                auVar161._12_2_ = auVar193._12_2_ >> 8;
                auVar161._14_2_ = auVar193._14_2_ >> 8;
                auVar186 = pmaddwd(auVar161,auVar186);
                auVar162._0_4_ = auVar186._0_4_ >> 8;
                auVar162._4_4_ = auVar186._4_4_ >> 8;
                auVar162._8_4_ = auVar186._8_4_ >> 8;
                auVar162._12_4_ = auVar186._12_4_ >> 8;
                auVar186 = packssdw(auVar162,auVar162);
                sVar139 = auVar186._0_2_;
                sVar142 = auVar186._2_2_;
                sVar173 = auVar186._4_2_;
                sVar184 = auVar186._6_2_;
                *puVar130 = CONCAT13((0 < sVar184) * (sVar184 < 0x100) * auVar186[6] -
                                     (0xff < sVar184),
                                     CONCAT12((0 < sVar173) * (sVar173 < 0x100) * auVar186[4] -
                                              (0xff < sVar173),
                                              CONCAT11((0 < sVar142) * (sVar142 < 0x100) *
                                                       auVar186[2] - (0xff < sVar142),
                                                       (0 < sVar139) * (sVar139 < 0x100) *
                                                       auVar186[0] - (0xff < sVar139))));
                uVar128 = uVar128 + uVar144;
                uVar122 = uVar122 + iVar119;
                puVar130 = puVar130 + 1;
              } while (puVar130 < end);
            }
          }
          else if (0 < length) {
            puVar5 = (data->field_23).texture.imageData;
            lVar131 = (data->field_23).texture.bytesPerLine;
            puVar130 = buffer;
            uVar128 = local_3c;
            do {
              uVar129 = uVar128 >> 8 & 0xff;
              uVar121 = (data->field_23).texture.width;
              uVar124 = (data->field_23).texture.height;
              iVar120 = ((int)uVar128 >> 0x10) % (int)uVar121;
              uVar135 = uVar122 >> 8 & 0xff;
              uVar136 = iVar120 >> 0x1f & uVar121;
              uVar137 = uVar136 + iVar120 + 1;
              if (uVar137 == uVar121) {
                uVar137 = 0;
              }
              iVar123 = ((int)uVar122 >> 0x10) % (int)uVar124;
              uVar121 = iVar123 >> 0x1f & uVar124;
              uVar133 = uVar121 + iVar123 + 1;
              if (uVar133 == uVar124) {
                uVar133 = 0;
              }
              lVar127 = (int)(uVar121 + iVar123) * lVar131;
              lVar134 = (int)uVar133 * lVar131;
              lVar132 = (long)(int)(iVar120 + uVar136);
              uVar174 = *(undefined4 *)(puVar5 + (long)(int)uVar137 * 4 + lVar127);
              uVar2 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar127);
              uVar3 = *(undefined4 *)(puVar5 + (long)(int)uVar137 * 4 + lVar134);
              uVar4 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar134);
              uVar138 = CONCAT44(uVar174,uVar2);
              auVar25._8_6_ = 0;
              auVar25._0_8_ = uVar138;
              auVar25[0xe] = (char)((uint)uVar174 >> 0x18);
              auVar33._8_4_ = 0;
              auVar33._0_8_ = uVar138;
              auVar33[0xc] = (char)((uint)uVar174 >> 0x10);
              auVar33._13_2_ = auVar25._13_2_;
              auVar41._8_4_ = 0;
              auVar41._0_8_ = uVar138;
              auVar41._12_3_ = auVar33._12_3_;
              auVar45._8_2_ = 0;
              auVar45._0_8_ = uVar138;
              auVar45[10] = (char)((uint)uVar174 >> 8);
              auVar45._11_4_ = auVar41._11_4_;
              auVar49._8_2_ = 0;
              auVar49._0_8_ = uVar138;
              auVar49._10_5_ = auVar45._10_5_;
              auVar53[8] = (char)uVar174;
              auVar53._0_8_ = uVar138;
              auVar53._9_6_ = auVar49._9_6_;
              auVar91._7_8_ = 0;
              auVar91._0_7_ = auVar53._8_7_;
              Var78 = CONCAT81(SUB158(auVar91 << 0x40,7),(char)((uint)uVar2 >> 0x18));
              auVar113._9_6_ = 0;
              auVar113._0_9_ = Var78;
              auVar61[4] = (char)((uint)uVar2 >> 0x10);
              auVar61._0_4_ = uVar2;
              auVar61._5_10_ = SUB1510(auVar113 << 0x30,5);
              auVar92._11_4_ = 0;
              auVar92._0_11_ = auVar61._4_11_;
              auVar93._1_12_ = SUB1512(auVar92 << 0x20,3);
              auVar93[0] = (char)((uint)uVar2 >> 8);
              uVar138 = CONCAT44(uVar3,uVar4);
              auVar186 = pshuflw(ZEXT416(0x100 - uVar135),ZEXT416(0x100 - uVar135),0);
              auVar26._8_6_ = 0;
              auVar26._0_8_ = uVar138;
              auVar26[0xe] = (char)((uint)uVar3 >> 0x18);
              auVar34._8_4_ = 0;
              auVar34._0_8_ = uVar138;
              auVar34[0xc] = (char)((uint)uVar3 >> 0x10);
              auVar34._13_2_ = auVar26._13_2_;
              auVar42._8_4_ = 0;
              auVar42._0_8_ = uVar138;
              auVar42._12_3_ = auVar34._12_3_;
              auVar46._8_2_ = 0;
              auVar46._0_8_ = uVar138;
              auVar46[10] = (char)((uint)uVar3 >> 8);
              auVar46._11_4_ = auVar42._11_4_;
              auVar50._8_2_ = 0;
              auVar50._0_8_ = uVar138;
              auVar50._10_5_ = auVar46._10_5_;
              auVar54[8] = (char)uVar3;
              auVar54._0_8_ = uVar138;
              auVar54._9_6_ = auVar50._9_6_;
              auVar94._7_8_ = 0;
              auVar94._0_7_ = auVar54._8_7_;
              Var82 = CONCAT81(SUB158(auVar94 << 0x40,7),(char)((uint)uVar4 >> 0x18));
              auVar114._9_6_ = 0;
              auVar114._0_9_ = Var82;
              auVar62[4] = (char)((uint)uVar4 >> 0x10);
              auVar62._0_4_ = uVar4;
              auVar62._5_10_ = SUB1510(auVar114 << 0x30,5);
              auVar95._11_4_ = 0;
              auVar95._0_11_ = auVar62._4_11_;
              auVar96._1_12_ = SUB1512(auVar95 << 0x20,3);
              auVar96[0] = (char)((uint)uVar4 >> 8);
              auVar193 = pshuflw(ZEXT416(uVar135),ZEXT416(uVar135),0);
              sVar139 = auVar186._0_2_;
              sVar142 = auVar186._2_2_;
              sVar173 = auVar193._0_2_;
              sVar184 = auVar193._2_2_;
              uVar174 = CONCAT22(sVar184 * auVar96._0_2_ + sVar142 * auVar93._0_2_,
                                 sVar173 * (ushort)(byte)uVar4 + sVar139 * (ushort)(byte)uVar2);
              auVar177._0_8_ =
                   CONCAT26(sVar184 * (short)Var82 + sVar142 * (short)Var78,
                            CONCAT24(sVar173 * auVar62._4_2_ + sVar139 * auVar61._4_2_,uVar174));
              auVar177._8_2_ = sVar173 * auVar54._8_2_ + sVar139 * auVar53._8_2_;
              auVar177._10_2_ = sVar184 * auVar46._10_2_ + sVar142 * auVar45._10_2_;
              auVar181._12_2_ = sVar173 * auVar34._12_2_ + sVar139 * auVar33._12_2_;
              auVar181._0_12_ = auVar177;
              auVar181._14_2_ = sVar184 * (auVar26._13_2_ >> 8) + sVar142 * (auVar25._13_2_ >> 8);
              auVar156._0_4_ = CONCAT22((short)uVar129,(short)(0x100 - uVar129));
              auVar156._4_4_ = auVar156._0_4_;
              auVar156._8_4_ = auVar156._0_4_;
              auVar156._12_4_ = auVar156._0_4_;
              auVar163._4_4_ = auVar177._8_4_;
              auVar163._0_4_ = uVar174;
              auVar163._8_4_ = (int)((ulong)auVar177._0_8_ >> 0x20);
              auVar163._12_4_ = auVar181._12_4_;
              auVar186 = pshuflw(auVar163,auVar163,0xd8);
              auVar186 = pshufhw(auVar186,auVar186,0xd8);
              auVar164._0_2_ = auVar186._0_2_ >> 8;
              auVar164._2_2_ = auVar186._2_2_ >> 8;
              auVar164._4_2_ = auVar186._4_2_ >> 8;
              auVar164._6_2_ = auVar186._6_2_ >> 8;
              auVar164._8_2_ = auVar186._8_2_ >> 8;
              auVar164._10_2_ = auVar186._10_2_ >> 8;
              auVar164._12_2_ = auVar186._12_2_ >> 8;
              auVar164._14_2_ = auVar186._14_2_ >> 8;
              auVar186 = pmaddwd(auVar164,auVar156);
              auVar165._0_4_ = auVar186._0_4_ >> 8;
              auVar165._4_4_ = auVar186._4_4_ >> 8;
              auVar165._8_4_ = auVar186._8_4_ >> 8;
              auVar165._12_4_ = auVar186._12_4_ >> 8;
              auVar186 = packssdw(auVar165,auVar165);
              sVar139 = auVar186._0_2_;
              sVar142 = auVar186._2_2_;
              sVar173 = auVar186._4_2_;
              sVar184 = auVar186._6_2_;
              *puVar130 = CONCAT13((0 < sVar184) * (sVar184 < 0x100) * auVar186[6] -
                                   (0xff < sVar184),
                                   CONCAT12((0 < sVar173) * (sVar173 < 0x100) * auVar186[4] -
                                            (0xff < sVar173),
                                            CONCAT11((0 < sVar142) * (sVar142 < 0x100) * auVar186[2]
                                                     - (0xff < sVar142),
                                                     (0 < sVar139) * (sVar139 < 0x100) * auVar186[0]
                                                     - (0xff < sVar139))));
              uVar128 = uVar128 + uVar144;
              uVar122 = uVar122 + iVar119;
              puVar130 = puVar130 + 1;
            } while (puVar130 < end);
          }
          goto LAB_0065a10a;
        }
        uVar128 = -uVar144;
        if (0 < (int)uVar144) {
          uVar128 = uVar144;
        }
        puVar130 = buffer;
        if (0x10000 < uVar128) {
          if (0x20000 < uVar128) {
            uVar128 = (data->field_23).texture.height;
            iVar119 = ((int)uVar122 >> 0x10) % (int)uVar128;
            uVar124 = iVar119 >> 0x1f & uVar128;
            uVar135 = uVar124 + iVar119 + 1;
            uVar138 = -(ulong)(dVar1 < -dVar1);
            uVar121 = 0;
            if (uVar135 != uVar128) {
              uVar121 = uVar135;
            }
            puVar5 = (data->field_23).texture.imageData;
            lVar131 = (data->field_23).texture.bytesPerLine;
            lVar127 = (int)(uVar124 + iVar119) * lVar131;
            lVar131 = (int)uVar121 * lVar131;
            if (0.125 <= (double)(~uVar138 & (ulong)dVar1 | (ulong)-dVar1 & uVar138)) {
              if (0 < length) {
                auVar186 = ZEXT416(0x100 - (uVar122 >> 8 & 0xff));
                auVar186 = pshuflw(auVar186,auVar186,0);
                auVar193 = pshuflw(ZEXT416(uVar122),ZEXT416(uVar122),0);
                uVar143 = auVar193._0_2_;
                uVar146 = auVar193._2_2_;
                do {
                  uVar122 = (data->field_23).texture.width;
                  iVar119 = (int)(CONCAT44((int)local_3c >> 0x1f,(int)local_3c >> 0x10) %
                                 (long)(int)uVar122);
                  uVar121 = iVar119 >> 0x1f & uVar122;
                  uVar128 = uVar121 + iVar119 + 1;
                  if (uVar128 == uVar122) {
                    uVar128 = 0;
                  }
                  lVar132 = (long)(int)(uVar121 + iVar119);
                  bVar125 = (byte)(local_3c >> 8);
                  uVar174 = *(undefined4 *)(puVar5 + (long)(int)uVar128 * 4 + lVar127);
                  uVar2 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar127);
                  uVar138 = CONCAT44(uVar174,uVar2);
                  uVar3 = *(undefined4 *)(puVar5 + (long)(int)uVar128 * 4 + lVar131);
                  uVar4 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar131);
                  uVar175 = CONCAT44(uVar3,uVar4);
                  auVar9._8_6_ = 0;
                  auVar9._0_8_ = uVar138;
                  auVar9[0xe] = (char)((uint)uVar174 >> 0x18);
                  auVar13._8_4_ = 0;
                  auVar13._0_8_ = uVar138;
                  auVar13[0xc] = (char)((uint)uVar174 >> 0x10);
                  auVar13._13_2_ = auVar9._13_2_;
                  auVar17._8_4_ = 0;
                  auVar17._0_8_ = uVar138;
                  auVar17._12_3_ = auVar13._12_3_;
                  auVar21._8_2_ = 0;
                  auVar21._0_8_ = uVar138;
                  auVar21[10] = (char)((uint)uVar174 >> 8);
                  auVar21._11_4_ = auVar17._11_4_;
                  auVar29._8_2_ = 0;
                  auVar29._0_8_ = uVar138;
                  auVar29._10_5_ = auVar21._10_5_;
                  auVar37[8] = (char)uVar174;
                  auVar37._0_8_ = uVar138;
                  auVar37._9_6_ = auVar29._9_6_;
                  auVar103._7_8_ = 0;
                  auVar103._0_7_ = auVar37._8_7_;
                  Var78 = CONCAT81(SUB158(auVar103 << 0x40,7),(char)((uint)uVar2 >> 0x18));
                  auVar117._9_6_ = 0;
                  auVar117._0_9_ = Var78;
                  auVar57[4] = (char)((uint)uVar2 >> 0x10);
                  auVar57._0_4_ = uVar2;
                  auVar57._5_10_ = SUB1510(auVar117 << 0x30,5);
                  auVar104._11_4_ = 0;
                  auVar104._0_11_ = auVar57._4_11_;
                  auVar105._1_12_ = SUB1512(auVar104 << 0x20,3);
                  auVar105[0] = (char)((uint)uVar2 >> 8);
                  sVar139 = auVar186._0_2_;
                  sVar142 = auVar186._2_2_;
                  auVar10._8_6_ = 0;
                  auVar10._0_8_ = uVar175;
                  auVar10[0xe] = (char)((uint)uVar3 >> 0x18);
                  auVar14._8_4_ = 0;
                  auVar14._0_8_ = uVar175;
                  auVar14[0xc] = (char)((uint)uVar3 >> 0x10);
                  auVar14._13_2_ = auVar10._13_2_;
                  auVar18._8_4_ = 0;
                  auVar18._0_8_ = uVar175;
                  auVar18._12_3_ = auVar14._12_3_;
                  auVar22._8_2_ = 0;
                  auVar22._0_8_ = uVar175;
                  auVar22[10] = (char)((uint)uVar3 >> 8);
                  auVar22._11_4_ = auVar18._11_4_;
                  auVar30._8_2_ = 0;
                  auVar30._0_8_ = uVar175;
                  auVar30._10_5_ = auVar22._10_5_;
                  auVar38[8] = (char)uVar3;
                  auVar38._0_8_ = uVar175;
                  auVar38._9_6_ = auVar30._9_6_;
                  auVar106._7_8_ = 0;
                  auVar106._0_7_ = auVar38._8_7_;
                  Var82 = CONCAT81(SUB158(auVar106 << 0x40,7),(char)((uint)uVar4 >> 0x18));
                  auVar118._9_6_ = 0;
                  auVar118._0_9_ = Var82;
                  auVar58[4] = (char)((uint)uVar4 >> 0x10);
                  auVar58._0_4_ = uVar4;
                  auVar58._5_10_ = SUB1510(auVar118 << 0x30,5);
                  auVar107._11_4_ = 0;
                  auVar107._0_11_ = auVar58._4_11_;
                  auVar108._1_12_ = SUB1512(auVar107 << 0x20,3);
                  auVar108[0] = (char)((uint)uVar4 >> 8);
                  uVar174 = CONCAT22(auVar108._0_2_ * (uVar146 >> 8) + auVar105._0_2_ * sVar142,
                                     (ushort)(byte)uVar4 * (uVar143 >> 8) +
                                     (ushort)(byte)uVar2 * sVar139);
                  auVar179._0_8_ =
                       CONCAT26((short)Var82 * (uVar146 >> 8) + (short)Var78 * sVar142,
                                CONCAT24(auVar58._4_2_ * (uVar143 >> 8) + auVar57._4_2_ * sVar139,
                                         uVar174));
                  auVar179._8_2_ = auVar38._8_2_ * (uVar143 >> 8) + auVar37._8_2_ * sVar139;
                  auVar179._10_2_ = auVar22._10_2_ * (uVar146 >> 8) + auVar21._10_2_ * sVar142;
                  auVar183._12_2_ = auVar14._12_2_ * (uVar143 >> 8) + auVar13._12_2_ * sVar139;
                  auVar183._0_12_ = auVar179;
                  auVar183._14_2_ =
                       (auVar10._13_2_ >> 8) * (uVar146 >> 8) + (auVar9._13_2_ >> 8) * sVar142;
                  uVar6 = CONCAT12(bVar125,0x100 - (ushort)bVar125);
                  auVar193[3] = 0;
                  auVar193._0_3_ = uVar6;
                  auVar193._4_3_ = uVar6;
                  auVar193[7] = 0;
                  auVar193._8_3_ = uVar6;
                  auVar193[0xb] = 0;
                  auVar193._12_3_ = uVar6;
                  auVar193[0xf] = 0;
                  auVar169._4_4_ = auVar179._8_4_;
                  auVar169._0_4_ = uVar174;
                  auVar169._8_4_ = (int)((ulong)auVar179._0_8_ >> 0x20);
                  auVar169._12_4_ = auVar183._12_4_;
                  auVar169 = pshuflw(auVar169,auVar169,0xd8);
                  auVar169 = pshufhw(auVar169,auVar169,0xd8);
                  auVar170._0_2_ = auVar169._0_2_ >> 8;
                  auVar170._2_2_ = auVar169._2_2_ >> 8;
                  auVar170._4_2_ = auVar169._4_2_ >> 8;
                  auVar170._6_2_ = auVar169._6_2_ >> 8;
                  auVar170._8_2_ = auVar169._8_2_ >> 8;
                  auVar170._10_2_ = auVar169._10_2_ >> 8;
                  auVar170._12_2_ = auVar169._12_2_ >> 8;
                  auVar170._14_2_ = auVar169._14_2_ >> 8;
                  auVar193 = pmaddwd(auVar170,auVar193);
                  auVar171._0_4_ = auVar193._0_4_ >> 8;
                  auVar171._4_4_ = auVar193._4_4_ >> 8;
                  auVar171._8_4_ = auVar193._8_4_ >> 8;
                  auVar171._12_4_ = auVar193._12_4_ >> 8;
                  auVar193 = packssdw(auVar171,auVar171);
                  sVar139 = auVar193._0_2_;
                  sVar142 = auVar193._2_2_;
                  sVar173 = auVar193._4_2_;
                  sVar184 = auVar193._6_2_;
                  *puVar130 = CONCAT13((0 < sVar184) * (sVar184 < 0x100) * auVar193[6] -
                                       (0xff < sVar184),
                                       CONCAT12((0 < sVar173) * (sVar173 < 0x100) * auVar193[4] -
                                                (0xff < sVar173),
                                                CONCAT11((0 < sVar142) * (sVar142 < 0x100) *
                                                         auVar193[2] - (0xff < sVar142),
                                                         (0 < sVar139) * (sVar139 < 0x100) *
                                                         auVar193[0] - (0xff < sVar139))));
                  local_3c = local_3c + uVar144;
                  puVar130 = puVar130 + 1;
                } while (puVar130 < end);
              }
            }
            else if (0 < length) {
              auVar186 = ZEXT416(0x100 - (uVar122 >> 8 & 0xff));
              auVar186 = pshuflw(auVar186,auVar186,0);
              auVar193 = pshuflw(ZEXT416(uVar122),ZEXT416(uVar122),0);
              uVar143 = auVar193._0_2_;
              uVar146 = auVar193._2_2_;
              do {
                uVar122 = (data->field_23).texture.width;
                iVar119 = (int)(CONCAT44((int)local_3c >> 0x1f,(int)local_3c >> 0x10) %
                               (long)(int)uVar122);
                uVar121 = iVar119 >> 0x1f & uVar122;
                uVar128 = uVar121 + iVar119 + 1;
                if (uVar128 == uVar122) {
                  uVar128 = 0;
                }
                lVar132 = (long)(int)(uVar121 + iVar119);
                bVar125 = (byte)(local_3c >> 8);
                uVar174 = *(undefined4 *)(puVar5 + (long)(int)uVar128 * 4 + lVar127);
                uVar2 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar127);
                uVar138 = CONCAT44(uVar174,uVar2);
                uVar3 = *(undefined4 *)(puVar5 + (long)(int)uVar128 * 4 + lVar131);
                uVar4 = *(undefined4 *)(puVar5 + lVar132 * 4 + lVar131);
                uVar175 = CONCAT44(uVar3,uVar4);
                auVar7._8_6_ = 0;
                auVar7._0_8_ = uVar138;
                auVar7[0xe] = (char)((uint)uVar174 >> 0x18);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar138;
                auVar11[0xc] = (char)((uint)uVar174 >> 0x10);
                auVar11._13_2_ = auVar7._13_2_;
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar138;
                auVar15._12_3_ = auVar11._12_3_;
                auVar19._8_2_ = 0;
                auVar19._0_8_ = uVar138;
                auVar19[10] = (char)((uint)uVar174 >> 8);
                auVar19._11_4_ = auVar15._11_4_;
                auVar27._8_2_ = 0;
                auVar27._0_8_ = uVar138;
                auVar27._10_5_ = auVar19._10_5_;
                auVar35[8] = (char)uVar174;
                auVar35._0_8_ = uVar138;
                auVar35._9_6_ = auVar27._9_6_;
                auVar97._7_8_ = 0;
                auVar97._0_7_ = auVar35._8_7_;
                Var78 = CONCAT81(SUB158(auVar97 << 0x40,7),(char)((uint)uVar2 >> 0x18));
                auVar115._9_6_ = 0;
                auVar115._0_9_ = Var78;
                auVar55[4] = (char)((uint)uVar2 >> 0x10);
                auVar55._0_4_ = uVar2;
                auVar55._5_10_ = SUB1510(auVar115 << 0x30,5);
                auVar98._11_4_ = 0;
                auVar98._0_11_ = auVar55._4_11_;
                auVar99._1_12_ = SUB1512(auVar98 << 0x20,3);
                auVar99[0] = (char)((uint)uVar2 >> 8);
                sVar139 = auVar186._0_2_;
                sVar142 = auVar186._2_2_;
                auVar8._8_6_ = 0;
                auVar8._0_8_ = uVar175;
                auVar8[0xe] = (char)((uint)uVar3 >> 0x18);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar175;
                auVar12[0xc] = (char)((uint)uVar3 >> 0x10);
                auVar12._13_2_ = auVar8._13_2_;
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar175;
                auVar16._12_3_ = auVar12._12_3_;
                auVar20._8_2_ = 0;
                auVar20._0_8_ = uVar175;
                auVar20[10] = (char)((uint)uVar3 >> 8);
                auVar20._11_4_ = auVar16._11_4_;
                auVar28._8_2_ = 0;
                auVar28._0_8_ = uVar175;
                auVar28._10_5_ = auVar20._10_5_;
                auVar36[8] = (char)uVar3;
                auVar36._0_8_ = uVar175;
                auVar36._9_6_ = auVar28._9_6_;
                auVar100._7_8_ = 0;
                auVar100._0_7_ = auVar36._8_7_;
                Var82 = CONCAT81(SUB158(auVar100 << 0x40,7),(char)((uint)uVar4 >> 0x18));
                auVar116._9_6_ = 0;
                auVar116._0_9_ = Var82;
                auVar56[4] = (char)((uint)uVar4 >> 0x10);
                auVar56._0_4_ = uVar4;
                auVar56._5_10_ = SUB1510(auVar116 << 0x30,5);
                auVar101._11_4_ = 0;
                auVar101._0_11_ = auVar56._4_11_;
                auVar102._1_12_ = SUB1512(auVar101 << 0x20,3);
                auVar102[0] = (char)((uint)uVar4 >> 8);
                uVar174 = CONCAT22(auVar102._0_2_ * (uVar146 >> 8) + auVar99._0_2_ * sVar142,
                                   (ushort)(byte)uVar4 * (uVar143 >> 8) +
                                   (ushort)(byte)uVar2 * sVar139);
                auVar178._0_8_ =
                     CONCAT26((short)Var82 * (uVar146 >> 8) + (short)Var78 * sVar142,
                              CONCAT24(auVar56._4_2_ * (uVar143 >> 8) + auVar55._4_2_ * sVar139,
                                       uVar174));
                auVar178._8_2_ = auVar36._8_2_ * (uVar143 >> 8) + auVar35._8_2_ * sVar139;
                auVar178._10_2_ = auVar20._10_2_ * (uVar146 >> 8) + auVar19._10_2_ * sVar142;
                auVar182._12_2_ = auVar12._12_2_ * (uVar143 >> 8) + auVar11._12_2_ * sVar139;
                auVar182._0_12_ = auVar178;
                auVar182._14_2_ =
                     (auVar8._13_2_ >> 8) * (uVar146 >> 8) + (auVar7._13_2_ >> 8) * sVar142;
                uVar6 = CONCAT12(bVar125,0x100 - (ushort)bVar125);
                auVar157[3] = 0;
                auVar157._0_3_ = uVar6;
                auVar157._4_3_ = uVar6;
                auVar157[7] = 0;
                auVar157._8_3_ = uVar6;
                auVar157[0xb] = 0;
                auVar157._12_3_ = uVar6;
                auVar157[0xf] = 0;
                auVar166._4_4_ = auVar178._8_4_;
                auVar166._0_4_ = uVar174;
                auVar166._8_4_ = (int)((ulong)auVar178._0_8_ >> 0x20);
                auVar166._12_4_ = auVar182._12_4_;
                auVar193 = pshuflw(auVar166,auVar166,0xd8);
                auVar193 = pshufhw(auVar193,auVar193,0xd8);
                auVar167._0_2_ = auVar193._0_2_ >> 8;
                auVar167._2_2_ = auVar193._2_2_ >> 8;
                auVar167._4_2_ = auVar193._4_2_ >> 8;
                auVar167._6_2_ = auVar193._6_2_ >> 8;
                auVar167._8_2_ = auVar193._8_2_ >> 8;
                auVar167._10_2_ = auVar193._10_2_ >> 8;
                auVar167._12_2_ = auVar193._12_2_ >> 8;
                auVar167._14_2_ = auVar193._14_2_ >> 8;
                auVar193 = pmaddwd(auVar167,auVar157);
                auVar168._0_4_ = auVar193._0_4_ >> 8;
                auVar168._4_4_ = auVar193._4_4_ >> 8;
                auVar168._8_4_ = auVar193._8_4_ >> 8;
                auVar168._12_4_ = auVar193._12_4_ >> 8;
                auVar193 = packssdw(auVar168,auVar168);
                sVar139 = auVar193._0_2_;
                sVar142 = auVar193._2_2_;
                sVar173 = auVar193._4_2_;
                sVar184 = auVar193._6_2_;
                *puVar130 = CONCAT13((0 < sVar184) * (sVar184 < 0x100) * auVar193[6] -
                                     (0xff < sVar184),
                                     CONCAT12((0 < sVar173) * (sVar173 < 0x100) * auVar193[4] -
                                              (0xff < sVar173),
                                              CONCAT11((0 < sVar142) * (sVar142 < 0x100) *
                                                       auVar193[2] - (0xff < sVar142),
                                                       (0 < sVar139) * (sVar139 < 0x100) *
                                                       auVar193[0] - (0xff < sVar139))));
                local_3c = local_3c + uVar144;
                puVar130 = puVar130 + 1;
              } while (puVar130 < end);
            }
            goto LAB_0065a10a;
          }
          uVar128 = length + 1U >> 1;
          if (length < 0x400) {
            uVar128 = length;
          }
          fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
                    (buffer,buffer + (int)uVar128,&(data->field_23).texture,(int *)&local_3c,
                     (int *)(ulong)uVar122,uVar144,in_stack_ffffffffffffff08);
          puVar130 = buffer + (int)uVar128;
          if (uVar128 == length) goto LAB_0065a10a;
        }
        fetchTransformedBilinearARGB32PM_simple_scale_helper<(TextureBlendType)5>
                  (puVar130,end,&(data->field_23).texture,(int *)&local_3c,(int *)(ulong)uVar122,
                   uVar144,in_stack_ffffffffffffff08);
        goto LAB_0065a10a;
      }
    }
  }
  if (0 < length) {
    dVar1 = data->m13;
    dVar159 = data->m23 * dVar158 + dVar145 * dVar1 + data->m33;
    dVar185 = data->dx + data->m21 * dVar158 + dVar145 * dVar196;
    uVar147 = SUB81(dVar185,0);
    uVar148 = (undefined1)((ulong)dVar185 >> 8);
    uVar149 = (undefined1)((ulong)dVar185 >> 0x10);
    uVar150 = (undefined1)((ulong)dVar185 >> 0x18);
    uVar151 = (undefined1)((ulong)dVar185 >> 0x20);
    uVar152 = (undefined1)((ulong)dVar185 >> 0x28);
    uVar153 = (undefined1)((ulong)dVar185 >> 0x30);
    uVar154 = (undefined1)((ulong)dVar185 >> 0x38);
    dVar145 = data->dy + data->m22 * dVar158 + dVar145 * dVar197;
    puVar5 = (data->field_23).texture.imageData;
    lVar131 = (data->field_23).texture.bytesPerLine;
    puVar130 = buffer;
    do {
      dVar158 = (double)(-(ulong)(dVar159 == 0.0) & 0x3ff0000000000000 |
                        ~-(ulong)(dVar159 == 0.0) & (ulong)(1.0 / dVar159));
      dVar185 = dVar158 * (double)CONCAT17(uVar154,CONCAT16(uVar153,CONCAT15(uVar152,CONCAT14(
                                                  uVar151,CONCAT13(uVar150,CONCAT12(uVar149,CONCAT11
                                                  (uVar148,uVar147))))))) + -0.5;
      dVar158 = dVar158 * dVar145 + -0.5;
      auVar188._8_8_ = -(ulong)(dVar158 < 0.0);
      auVar188._0_8_ = -(ulong)(dVar185 < 0.0);
      uVar122 = movmskpd((int)uVar138,auVar188);
      iVar119 = (int)dVar185 - (uVar122 & 1);
      iVar123 = (int)dVar158 - (uVar122 >> 1 & 0x7f);
      uVar122 = (data->field_23).texture.width;
      uVar144 = (data->field_23).texture.height;
      iVar120 = iVar119 % (int)uVar122;
      uVar121 = iVar120 >> 0x1f & uVar122;
      uVar128 = uVar121 + iVar120 + 1;
      if (uVar128 == uVar122) {
        uVar128 = 0;
      }
      iVar126 = iVar123 % (int)uVar144;
      iVar119 = (int)((dVar185 - (double)iVar119) * 256.0);
      uVar124 = (uint)((dVar158 - (double)iVar123) * 256.0);
      uVar135 = iVar126 >> 0x1f & uVar144;
      uVar122 = uVar135 + iVar126 + 1;
      if (uVar122 == uVar144) {
        uVar122 = 0;
      }
      lVar127 = (int)(iVar126 + uVar135) * lVar131;
      lVar132 = (int)uVar122 * lVar131;
      lVar134 = (long)(int)(uVar121 + iVar120);
      uVar174 = *(undefined4 *)(puVar5 + (long)(int)uVar128 * 4 + lVar127);
      uVar2 = *(undefined4 *)(puVar5 + lVar134 * 4 + lVar127);
      uVar3 = *(undefined4 *)(puVar5 + (long)(int)uVar128 * 4 + lVar132);
      uVar4 = *(undefined4 *)(puVar5 + lVar134 * 4 + lVar132);
      uVar138 = CONCAT44(uVar174,uVar2);
      bVar125 = (byte)((uint)uVar174 >> 0x18);
      auVar63._8_6_ = 0;
      auVar63._0_8_ = uVar138;
      auVar63[0xe] = bVar125;
      auVar65._8_4_ = 0;
      auVar65._0_8_ = uVar138;
      auVar65[0xc] = (char)((uint)uVar174 >> 0x10);
      auVar65._13_2_ = auVar63._13_2_;
      auVar67._8_4_ = 0;
      auVar67._0_8_ = uVar138;
      auVar67._12_3_ = auVar65._12_3_;
      auVar69._8_2_ = 0;
      auVar69._0_8_ = uVar138;
      auVar69[10] = (char)((uint)uVar174 >> 8);
      auVar69._11_4_ = auVar67._11_4_;
      auVar71._8_2_ = 0;
      auVar71._0_8_ = uVar138;
      auVar71._10_5_ = auVar69._10_5_;
      auVar73[8] = (char)uVar174;
      auVar73._0_8_ = uVar138;
      auVar73._9_6_ = auVar71._9_6_;
      auVar77._7_8_ = 0;
      auVar77._0_7_ = auVar73._8_7_;
      Var78 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)((uint)uVar2 >> 0x18));
      auVar109._9_6_ = 0;
      auVar109._0_9_ = Var78;
      auVar75[4] = (char)((uint)uVar2 >> 0x10);
      auVar75._0_4_ = uVar2;
      auVar75._5_10_ = SUB1510(auVar109 << 0x30,5);
      auVar79._11_4_ = 0;
      auVar79._0_11_ = auVar75._4_11_;
      auVar80._1_12_ = SUB1512(auVar79 << 0x20,3);
      auVar80[0] = (char)((uint)uVar2 >> 8);
      uVar138 = CONCAT44(uVar3,uVar4);
      auVar186 = pshuflw(ZEXT416(0x100 - uVar124),ZEXT416(0x100 - uVar124),0);
      bVar195 = (byte)((uint)uVar3 >> 0x18);
      auVar64._8_6_ = 0;
      auVar64._0_8_ = uVar138;
      auVar64[0xe] = bVar195;
      auVar66._8_4_ = 0;
      auVar66._0_8_ = uVar138;
      auVar66[0xc] = (char)((uint)uVar3 >> 0x10);
      auVar66._13_2_ = auVar64._13_2_;
      auVar68._8_4_ = 0;
      auVar68._0_8_ = uVar138;
      auVar68._12_3_ = auVar66._12_3_;
      auVar70._8_2_ = 0;
      auVar70._0_8_ = uVar138;
      auVar70[10] = (char)((uint)uVar3 >> 8);
      auVar70._11_4_ = auVar68._11_4_;
      auVar72._8_2_ = 0;
      auVar72._0_8_ = uVar138;
      auVar72._10_5_ = auVar70._10_5_;
      auVar74[8] = (char)uVar3;
      auVar74._0_8_ = uVar138;
      auVar74._9_6_ = auVar72._9_6_;
      auVar81._7_8_ = 0;
      auVar81._0_7_ = auVar74._8_7_;
      Var82 = CONCAT81(SUB158(auVar81 << 0x40,7),(char)((uint)uVar4 >> 0x18));
      auVar110._9_6_ = 0;
      auVar110._0_9_ = Var82;
      auVar76[4] = (char)((uint)uVar4 >> 0x10);
      auVar76._0_4_ = uVar4;
      auVar76._5_10_ = SUB1510(auVar110 << 0x30,5);
      auVar83._11_4_ = 0;
      auVar83._0_11_ = auVar76._4_11_;
      auVar84._1_12_ = SUB1512(auVar83 << 0x20,3);
      auVar84[0] = (char)((uint)uVar4 >> 8);
      auVar193 = pshuflw(ZEXT416(uVar124),ZEXT416(uVar124),0);
      sVar139 = auVar186._0_2_;
      sVar142 = auVar186._2_2_;
      sVar173 = auVar193._0_2_;
      sVar184 = auVar193._2_2_;
      uVar174 = CONCAT22(sVar184 * auVar84._0_2_ + sVar142 * auVar80._0_2_,
                         sVar173 * (ushort)(byte)uVar4 + sVar139 * (ushort)(byte)uVar2);
      auVar192._0_8_ =
           CONCAT26(sVar184 * (short)Var82 + sVar142 * (short)Var78,
                    CONCAT24(sVar173 * auVar76._4_2_ + sVar139 * auVar75._4_2_,uVar174));
      auVar192._8_2_ = sVar173 * auVar74._8_2_ + sVar139 * auVar73._8_2_;
      auVar192._10_2_ = sVar184 * auVar70._10_2_ + sVar142 * auVar69._10_2_;
      auVar194._12_2_ = sVar173 * auVar66._12_2_ + sVar139 * auVar65._12_2_;
      auVar194._0_12_ = auVar192;
      auVar194._14_2_ = sVar184 * (ushort)bVar195 + sVar142 * (ushort)bVar125;
      uVar122 = 0x100 - iVar119;
      uVar138 = (ulong)uVar122;
      auVar187._0_4_ = CONCAT22((short)iVar119,(short)uVar122);
      auVar187._4_4_ = auVar187._0_4_;
      auVar187._8_4_ = auVar187._0_4_;
      auVar187._12_4_ = auVar187._0_4_;
      auVar189._4_4_ = auVar192._8_4_;
      auVar189._0_4_ = uVar174;
      auVar189._8_4_ = (int)((ulong)auVar192._0_8_ >> 0x20);
      auVar189._12_4_ = auVar194._12_4_;
      auVar186 = pshuflw(auVar189,auVar189,0xd8);
      auVar186 = pshufhw(auVar186,auVar186,0xd8);
      auVar190._0_2_ = auVar186._0_2_ >> 8;
      auVar190._2_2_ = auVar186._2_2_ >> 8;
      auVar190._4_2_ = auVar186._4_2_ >> 8;
      auVar190._6_2_ = auVar186._6_2_ >> 8;
      auVar190._8_2_ = auVar186._8_2_ >> 8;
      auVar190._10_2_ = auVar186._10_2_ >> 8;
      auVar190._12_2_ = auVar186._12_2_ >> 8;
      auVar190._14_2_ = auVar186._14_2_ >> 8;
      auVar186 = pmaddwd(auVar190,auVar187);
      auVar191._0_4_ = auVar186._0_4_ >> 8;
      auVar191._4_4_ = auVar186._4_4_ >> 8;
      auVar191._8_4_ = auVar186._8_4_ >> 8;
      auVar191._12_4_ = auVar186._12_4_ >> 8;
      dVar158 = (double)CONCAT17(uVar154,CONCAT16(uVar153,CONCAT15(uVar152,CONCAT14(uVar151,CONCAT13
                                                  (uVar150,CONCAT12(uVar149,CONCAT11(uVar148,uVar147
                                                                                    ))))))) +
                dVar196;
      uVar147 = SUB81(dVar158,0);
      uVar148 = (undefined1)((ulong)dVar158 >> 8);
      uVar149 = (undefined1)((ulong)dVar158 >> 0x10);
      uVar150 = (undefined1)((ulong)dVar158 >> 0x18);
      uVar151 = (undefined1)((ulong)dVar158 >> 0x20);
      uVar152 = (undefined1)((ulong)dVar158 >> 0x28);
      uVar153 = (undefined1)((ulong)dVar158 >> 0x30);
      uVar154 = (undefined1)((ulong)dVar158 >> 0x38);
      dVar145 = dVar145 + dVar197;
      auVar186 = packssdw(auVar191,auVar191);
      dVar159 = dVar159 + dVar1;
      sVar139 = auVar186._0_2_;
      sVar142 = auVar186._2_2_;
      sVar173 = auVar186._4_2_;
      sVar184 = auVar186._6_2_;
      *puVar130 = CONCAT13((0 < sVar184) * (sVar184 < 0x100) * auVar186[6] - (0xff < sVar184),
                           CONCAT12((0 < sVar173) * (sVar173 < 0x100) * auVar186[4] -
                                    (0xff < sVar173),
                                    CONCAT11((0 < sVar142) * (sVar142 < 0x100) * auVar186[2] -
                                             (0xff < sVar142),
                                             (0 < sVar139) * (sVar139 < 0x100) * auVar186[0] -
                                             (0xff < sVar139))));
      dVar159 = (double)((ulong)dVar159 & -(ulong)(dVar159 != 0.0) |
                        ~-(ulong)(dVar159 != 0.0) & (ulong)(dVar1 + dVar159));
      puVar130 = puVar130 + 1;
    } while (puVar130 < end);
  }
LAB_0065a10a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}